

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImTriangulator::BuildReflexes(ImTriangulator *this)

{
  int iVar1;
  ImTriangulatorNode *pIVar2;
  bool bVar3;
  int iVar4;
  ImTriangulatorNode **ppIVar5;
  
  ppIVar5 = &this->_Nodes;
  for (iVar4 = this->_TrianglesLeft; -1 < iVar4; iVar4 = iVar4 + -1) {
    pIVar2 = *ppIVar5;
    bVar3 = ImTriangleIsClockwise(&pIVar2->Prev->Pos,&pIVar2->Pos,&pIVar2->Next->Pos);
    if (!bVar3) {
      pIVar2->Type = ImTriangulatorNodeType_Reflex;
      iVar1 = (this->_Reflexes).Size;
      (this->_Reflexes).Size = iVar1 + 1;
      (this->_Reflexes).Data[iVar1] = pIVar2;
    }
    ppIVar5 = &pIVar2->Next;
  }
  return;
}

Assistant:

void ImTriangulator::BuildReflexes()
{
    ImTriangulatorNode* n1 = _Nodes;
    for (int i = _TrianglesLeft; i >= 0; i--, n1 = n1->Next)
    {
        if (ImTriangleIsClockwise(n1->Prev->Pos, n1->Pos, n1->Next->Pos))
            continue;
        n1->Type = ImTriangulatorNodeType_Reflex;
        _Reflexes.push_back(n1);
    }
}